

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

StringRef * __thiscall Catch::StringRef::operator=(StringRef *this,StringRef *other)

{
  Ownership OVar1;
  
  if (other != this) {
    if (this->m_ownership == FullStringOwned) {
      operator_delete(this->m_data,1);
    }
    this->m_data = other->m_data;
    this->m_size = other->m_size;
    OVar1 = FullStringRef;
    if (other->m_ownership != FullStringOwned) {
      OVar1 = other->m_ownership;
    }
    this->m_ownership = OVar1;
  }
  return this;
}

Assistant:

auto StringRef::operator = ( StringRef const& other ) -> StringRef& {
        if( &other == this )
            return *this;
        deleteIfOwned();
        m_data = other.m_data;
        m_size = other.m_size;
        if( other.m_ownership == Ownership::FullStringOwned )
            m_ownership = Ownership::FullStringRef;
            else
                m_ownership = other.m_ownership;
                return *this;
    }